

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_service_base.hpp
# Opt level: O0

size_t __thiscall
asio::detail::reactive_socket_service_base::receive<asio::mutable_buffers_1>
          (reactive_socket_service_base *this,base_implementation_type *impl,
          mutable_buffers_1 *buffers,message_flags flags,error_code *ec)

{
  size_t sVar1;
  int in_ECX;
  mutable_buffers_1 *in_RDX;
  void *in_RSI;
  undefined8 in_RDI;
  error_code *in_R8;
  mutable_buffer local_48;
  mutable_buffer local_38;
  
  local_38 = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::first(in_RDX);
  mutable_buffer::data((mutable_buffer *)&local_38);
  local_48 = buffer_sequence_adapter<asio::mutable_buffer,_asio::mutable_buffers_1>::first(in_RDX);
  mutable_buffer::size((mutable_buffer *)&local_48);
  sVar1 = socket_ops::sync_recv1
                    ((socket_type)((ulong)in_RDI >> 0x20),(state_type)((ulong)in_RDI >> 0x18),in_RSI
                     ,(size_t)in_RDX,in_ECX,in_R8);
  return sVar1;
}

Assistant:

size_t receive(base_implementation_type& impl,
      const MutableBufferSequence& buffers,
      socket_base::message_flags flags, asio::error_code& ec)
  {
    typedef buffer_sequence_adapter<asio::mutable_buffer,
        MutableBufferSequence> bufs_type;

    if (bufs_type::is_single_buffer)
    {
      return socket_ops::sync_recv1(impl.socket_,
          impl.state_, bufs_type::first(buffers).data(),
          bufs_type::first(buffers).size(), flags, ec);
    }
    else
    {
      bufs_type bufs(buffers);
      return socket_ops::sync_recv(impl.socket_, impl.state_,
          bufs.buffers(), bufs.count(), flags, bufs.all_empty(), ec);
    }
  }